

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O0

void __thiscall netbase_tests::netbase_lookupnumeric::test_method(netbase_lookupnumeric *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff718;
  undefined7 in_stack_fffffffffffff720;
  undefined1 in_stack_fffffffffffff727;
  assertion_result *in_stack_fffffffffffff728;
  const_string *in_stack_fffffffffffff740;
  const_string *msg;
  size_t in_stack_fffffffffffff748;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffff750;
  const_string *file;
  string *in_stack_fffffffffffff758;
  string *in_stack_fffffffffffff760;
  undefined7 in_stack_fffffffffffff768;
  undefined1 in_stack_fffffffffffff76f;
  const_string local_6c8 [2];
  lazy_ostream local_6a8 [2];
  allocator<char> local_682;
  undefined1 local_681 [25];
  const_string local_668;
  undefined1 local_658 [16];
  const_string local_648 [2];
  lazy_ostream local_628 [2];
  allocator<char> local_602;
  allocator<char> local_601;
  assertion_result local_600 [2];
  const_string local_5c8 [2];
  lazy_ostream local_5a8 [2];
  allocator<char> local_582;
  allocator<char> local_581;
  assertion_result local_580 [2];
  const_string local_548 [2];
  lazy_ostream local_528 [2];
  allocator<char> local_502;
  allocator<char> local_501;
  assertion_result local_500 [2];
  const_string local_4c8 [2];
  lazy_ostream local_4a8 [2];
  allocator<char> local_482;
  allocator<char> local_481;
  assertion_result local_480 [2];
  const_string local_448 [2];
  lazy_ostream local_428 [2];
  allocator<char> local_402;
  allocator<char> local_401;
  assertion_result local_400 [2];
  const_string local_3c8 [2];
  lazy_ostream local_3a8 [2];
  allocator<char> local_382;
  allocator<char> local_381;
  assertion_result local_380 [2];
  const_string local_348 [2];
  lazy_ostream local_328 [2];
  allocator<char> local_302;
  allocator<char> local_301;
  assertion_result local_300 [2];
  const_string local_2c8 [2];
  lazy_ostream local_2a8 [2];
  allocator<char> local_282;
  allocator<char> local_281;
  assertion_result local_280 [26];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
               in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    TestParse(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff728,(bool)in_stack_fffffffffffff727);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    in_stack_fffffffffffff718 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_280,local_2a8,local_2c8,0x81,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff718);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff718);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_282);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_281);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
               in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    TestParse(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff728,(bool)in_stack_fffffffffffff727);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    in_stack_fffffffffffff718 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_300,local_328,local_348,0x82,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff718);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff718);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_302);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_301);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
               in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    TestParse(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff728,(bool)in_stack_fffffffffffff727);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    in_stack_fffffffffffff718 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_380,local_3a8,local_3c8,0x83,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff718);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff718);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_382);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_381);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
               in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    TestParse(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff728,(bool)in_stack_fffffffffffff727);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    in_stack_fffffffffffff718 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_400,local_428,local_448,0x84,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff718);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff718);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_402);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_401);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
               in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    TestParse(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff728,(bool)in_stack_fffffffffffff727);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    in_stack_fffffffffffff718 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_480,local_4a8,local_4c8,0x85,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff718);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff718);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_482);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_481);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
               in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    TestParse(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff728,(bool)in_stack_fffffffffffff727);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    in_stack_fffffffffffff718 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_500,local_528,local_548,0x86,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff718);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff718);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_502);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_501);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
               in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    TestParse(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff728,(bool)in_stack_fffffffffffff727);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    in_stack_fffffffffffff718 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_580,local_5a8,local_5c8,0x87,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff718);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff718);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_582);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_581);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
               in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    in_stack_fffffffffffff76f = TestParse(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff728,(bool)in_stack_fffffffffffff727);
    in_stack_fffffffffffff760 = (string *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    in_stack_fffffffffffff718 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_600,local_628,local_648,0x8a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff718);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff718);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_602);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_601);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    line_num = local_658;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    file = &local_668;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff758,file,(size_t)line_num,msg);
    in_stack_fffffffffffff758 = (string *)local_681;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
               (char *)in_stack_fffffffffffff760,(allocator<char> *)in_stack_fffffffffffff758);
    TestParse(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff728,(bool)in_stack_fffffffffffff727);
    in_stack_fffffffffffff728 = (assertion_result *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               (unsigned_long)in_stack_fffffffffffff718);
    in_stack_fffffffffffff718 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_681 + 1),local_6a8,local_6c8,0x8c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff718);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff718);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator(&local_682);
    std::__cxx11::string::~string(in_stack_fffffffffffff718);
    std::allocator<char>::~allocator((allocator<char> *)local_681);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(netbase_lookupnumeric)
{
    BOOST_CHECK(TestParse("127.0.0.1", "127.0.0.1:65535"));
    BOOST_CHECK(TestParse("127.0.0.1:8333", "127.0.0.1:8333"));
    BOOST_CHECK(TestParse("::ffff:127.0.0.1", "127.0.0.1:65535"));
    BOOST_CHECK(TestParse("::", "[::]:65535"));
    BOOST_CHECK(TestParse("[::]:8333", "[::]:8333"));
    BOOST_CHECK(TestParse("[127.0.0.1]", "127.0.0.1:65535"));
    BOOST_CHECK(TestParse(":::", "[::]:0"));

    // verify that an internal address fails to resolve
    BOOST_CHECK(TestParse("[fd6b:88c0:8724:1:2:3:4:5]", "[::]:0"));
    // and that a one-off resolves correctly
    BOOST_CHECK(TestParse("[fd6c:88c0:8724:1:2:3:4:5]", "[fd6c:88c0:8724:1:2:3:4:5]:65535"));
}